

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O1

void __thiscall Handler::AddCommand(Handler *this,string *command,Event *event)

{
  pointer pcVar1;
  __hashtable *__h;
  Event *local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  Event *local_18;
  
  pcVar1 = (command->_M_dataplus)._M_p;
  local_40 = event;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + command->_M_string_length);
  local_18 = local_40;
  local_40 = (Event *)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<Event,std::default_delete<Event>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this);
  if (local_18 != (Event *)0x0) {
    std::default_delete<Event>::operator()((default_delete<Event> *)&local_18,local_18);
  }
  local_18 = (Event *)0x0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  if (local_40 != (Event *)0x0) {
    std::default_delete<Event>::operator()((default_delete<Event> *)&local_40,local_40);
  }
  return;
}

Assistant:

void Handler::AddCommand(const std::string &command, Event* event) {
    m_Commands.insert({command, std::unique_ptr<Event>(event)});
}